

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t archive_read_disk_set_matching
                  (archive *_a,archive *_ma,
                  _func_void_archive_ptr_void_ptr_archive_entry_ptr *_excluded_func,
                  void *_client_data)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_set_matching");
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else {
    _a[2].vtable = (archive_vtable_conflict *)_ma;
    *(_func_void_archive_ptr_void_ptr_archive_entry_ptr **)&_a[2].archive_format = _excluded_func;
    _a[2].archive_format_name = (char *)_client_data;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_read_disk_set_matching(struct archive *_a, struct archive *_ma,
    void (*_excluded_func)(struct archive *, void *, struct archive_entry *),
    void *_client_data)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_set_matching");
	a->matching = _ma;
	a->excluded_cb_func = _excluded_func;
	a->excluded_cb_data = _client_data;
	return (ARCHIVE_OK);
}